

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O0

void WcsicmpNegativeTest(void)

{
  bool bVar1;
  char *pcVar2;
  unsigned_long *in_R9;
  AssertionHelper local_418;
  Fixed local_3e8;
  int local_260;
  char local_25c [4];
  undefined1 local_258 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_228;
  Fixed local_1f8;
  unsigned_long local_60;
  char local_58 [8];
  undefined1 local_50 [8];
  AssertionResult iutest_ar;
  wchar_t negative_sample [5];
  wchar_t negative;
  
  iutest_ar.m_result = true;
  iutest_ar._33_7_ = 0x61000000;
  iutest::detail::AlwaysZero();
  local_58[0] = '\x04';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_60 = 4;
  iutest::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((AssertionResult *)local_50,(internal *)"sizeof(::std::wint_t)","sizeof(int)",local_58,
             &local_60,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    memset(&local_1f8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1f8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_50);
    iutest::AssertionHelper::AssertionHelper
              (&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x30,pcVar2,kAssumeFailure);
    iutest::AssertionHelper::operator=(&local_228,&local_1f8);
    iutest::AssertionHelper::~AssertionHelper(&local_228);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1f8);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    local_25c[0] = '\0';
    local_25c[1] = '\0';
    local_25c[2] = '\0';
    local_25c[3] = '\0';
    local_260 = iutest::detail::iu_wcsicmp(L"AAA",(wchar_t *)&iutest_ar.m_result);
    iutest::internal::CmpHelperLT<int,int>
              ((AssertionResult *)local_258,(internal *)0x1c9d22,
               "::iutest::detail::iu_wcsicmp(L\"AAA\", negative_sample)",local_25c,&local_260,
               (int *)in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
    if (!bVar1) {
      memset(&local_3e8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3e8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_258);
      iutest::AssertionHelper::AssertionHelper
                (&local_418,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
                 ,0x31,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_418,&local_3e8);
      iutest::AssertionHelper::~AssertionHelper(&local_418);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3e8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  }
  return;
}

Assistant:

void WcsicmpNegativeTest()
{
    const wchar_t negative = static_cast<wchar_t>(-1);
    const wchar_t negative_sample[] = { L'a', L'a', L'a', negative, L'\0' };
    IUTEST_ASSUME_GE(sizeof(::std::wint_t), sizeof(int));
    IUTEST_EXPECT_LT(0, ::iutest::detail::iu_wcsicmp(L"AAA", negative_sample));
}